

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::builtin_to_glsl_abi_cxx11_
          (CompilerGLSL *this,BuiltIn builtin,StorageClass storage)

{
  SPIREntryPoint *pSVar1;
  CompilerError *pCVar2;
  int in_ECX;
  undefined4 in_register_00000034;
  CompilerGLSL *this_00;
  spirv_cross local_580 [38];
  allocator local_55a;
  allocator local_559;
  string local_558 [38];
  undefined1 local_532;
  allocator local_531;
  string local_530 [38];
  undefined1 local_50a;
  allocator local_509;
  string local_508 [38];
  allocator local_4e2;
  allocator local_4e1;
  string local_4e0 [38];
  allocator local_4ba;
  allocator local_4b9;
  string local_4b8 [38];
  undefined1 local_492;
  allocator local_491;
  string local_490 [38];
  undefined1 local_46a;
  allocator local_469;
  string local_468 [38];
  allocator local_442;
  allocator local_441;
  string local_440 [38];
  undefined1 local_41a;
  allocator local_419;
  string local_418 [38];
  undefined1 local_3f2;
  allocator local_3f1;
  string local_3f0 [39];
  allocator local_3c9;
  allocator local_3c8;
  allocator local_3c7;
  allocator local_3c6;
  allocator local_3c5;
  allocator local_3c4;
  allocator local_3c3;
  allocator local_3c2;
  allocator local_3c1;
  allocator local_3c0;
  allocator local_3bf;
  allocator local_3be;
  allocator local_3bd;
  allocator local_3bc;
  allocator local_3bb;
  allocator local_3ba;
  allocator local_3b9;
  allocator local_3b8;
  allocator local_3b7;
  allocator local_3b6;
  allocator local_3b5;
  allocator local_3b4;
  allocator local_3b3;
  allocator local_3b2;
  allocator local_3b1;
  string local_3b0 [38];
  allocator local_38a;
  allocator local_389;
  string local_388 [37];
  allocator local_363;
  undefined1 local_362;
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [36];
  allocator local_314;
  allocator local_313;
  undefined1 local_312;
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [37];
  allocator local_2c3;
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [38];
  allocator local_272;
  allocator local_271;
  string local_270 [37];
  allocator local_24b;
  allocator local_24a;
  allocator local_249;
  string local_248 [38];
  undefined1 local_222;
  allocator local_221;
  string local_220 [38];
  allocator local_1fa;
  allocator local_1f9;
  string local_1f8 [37];
  allocator local_1d3;
  allocator local_1d2;
  allocator local_1d1;
  string local_1d0 [38];
  undefined1 local_1aa;
  allocator local_1a9;
  string local_1a8 [38];
  allocator local_182;
  allocator local_181;
  string local_180 [37];
  allocator local_15b;
  allocator local_15a;
  allocator local_159;
  string local_158 [38];
  undefined1 local_132;
  allocator local_131;
  string local_130 [34];
  allocator local_10e;
  allocator local_10d;
  allocator local_10c;
  allocator local_10b;
  allocator local_10a;
  allocator local_109;
  allocator local_108;
  allocator local_107;
  allocator local_106;
  allocator local_105;
  allocator local_104;
  allocator local_103;
  allocator local_102;
  allocator local_101;
  allocator local_100;
  allocator local_ff;
  allocator local_fe;
  allocator local_fd;
  allocator local_fc;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [35];
  allocator local_ad;
  allocator local_ac;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  string local_a8 [38];
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  ExecutionModel local_60;
  allocator local_5b;
  undefined1 local_5a;
  allocator local_59;
  ExecutionModel model;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  int local_20;
  StorageClass local_1c;
  StorageClass storage_local;
  BuiltIn builtin_local;
  CompilerGLSL *this_local;
  
  this_00 = (CompilerGLSL *)CONCAT44(in_register_00000034,builtin);
  local_1c = storage;
  _storage_local = this_00;
  this_local = this;
  if (storage == StorageClassUniformConstant) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_Position",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else if (storage == StorageClassInput) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_PointSize",local_35);
    ::std::allocator<char>::~allocator((allocator<char> *)local_35);
  }
  else if (storage == StorageClassOutput) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_ClipDistance",&local_36);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_36);
  }
  else if (storage == StorageClassWorkgroup) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_CullDistance",&local_37);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_37);
  }
  else if (storage == StorageClassCrossWorkgroup) {
    if (((this_00->options).vulkan_semantics & 1U) != 0) {
      local_5a = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&model,
                 "Cannot implement gl_VertexID in Vulkan GLSL. This shader was created with GL semantics."
                 ,&local_59);
      CompilerError::CompilerError(pCVar2,(string *)&model);
      local_5a = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_VertexID",&local_5b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5b);
  }
  else if (storage == StorageClassPrivate) {
    if (((this_00->options).vulkan_semantics & 1U) != 0) {
      pSVar1 = Compiler::get_entry_point((Compiler *)this_00);
      local_60 = pSVar1->model;
      if (2 < local_60 - ExecutionModelIntersectionKHR) {
        local_82 = 1;
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_80,
                   "Cannot implement gl_InstanceID in Vulkan GLSL. This shader was created with GL semantics."
                   ,&local_81);
        CompilerError::CompilerError(pCVar2,(string *)local_80);
        local_82 = 0;
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 0x8c)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a8,"GL_ARB_draw_instanced",&local_a9);
      require_extension_internal(this_00,(string *)local_a8);
      ::std::__cxx11::string::~string(local_a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_InstanceID",&local_aa);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_aa);
  }
  else if (storage == StorageClassFunction) {
    if ((in_ECX == 1) &&
       (pSVar1 = Compiler::get_entry_point((Compiler *)this_00),
       pSVar1->model == ExecutionModelGeometry)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_PrimitiveIDIn",&local_fc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_PrimitiveID",&local_fd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd);
    }
  }
  else if (storage == StorageClassGeneric) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_InvocationID",&local_fe);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_fe);
  }
  else if (storage == StorageClassPushConstant) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_Layer",&local_ff);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_ff);
  }
  else if (storage == StorageClassAtomicCounter) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_ViewportIndex",&local_100);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_100);
  }
  else if (storage == StorageClassImage) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_TessLevelOuter",&local_101);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  else if (storage == StorageClassStorageBuffer) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_TessLevelInner",&local_102);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_102);
  }
  else if (storage == (StorageClassStorageBuffer|StorageClassInput)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_TessCoord",&local_103);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_103);
  }
  else if (storage == (StorageClassStorageBuffer|StorageClassOutput)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_FragCoord",&local_104);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_104);
  }
  else if (storage == 0x10) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_PointCoord",&local_105);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_105);
  }
  else if (storage == 0x11) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_FrontFacing",&local_106);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_106);
  }
  else if (storage == 0x12) {
    if ((((this_00->options).es & 1U) != 0) && ((this_00->options).version < 0x140)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_298,"GL_OES_sample_variables",&local_299);
      require_extension_internal(this_00,(string *)local_298);
      ::std::__cxx11::string::~string(local_298);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_299);
    }
    if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 400)) {
      local_2c2 = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_2c0,"gl_SampleID not supported before GLSL 400.",&local_2c1);
      CompilerError::CompilerError(pCVar2,(string *)local_2c0);
      local_2c2 = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SampleID",&local_2c3);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2c3);
  }
  else if (storage == 0x13) {
    if ((((this_00->options).es & 1U) != 0) && ((this_00->options).version < 0x140)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_338,"GL_OES_sample_variables",&local_339);
      require_extension_internal(this_00,(string *)local_338);
      ::std::__cxx11::string::~string(local_338);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_339);
    }
    if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 400)) {
      local_362 = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_360,"gl_SamplePosition not supported before GLSL 400.",&local_361);
      CompilerError::CompilerError(pCVar2,(string *)local_360);
      local_362 = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SamplePosition",&local_363);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_363);
  }
  else if (storage == 0x14) {
    local_20 = in_ECX;
    if ((((this_00->options).es & 1U) != 0) && ((this_00->options).version < 0x140)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2e8,"GL_OES_sample_variables",&local_2e9);
      require_extension_internal(this_00,(string *)local_2e8);
      ::std::__cxx11::string::~string(local_2e8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    }
    if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 400)) {
      local_312 = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_310,"gl_SampleMask/gl_SampleMaskIn not supported before GLSL 400.",&local_311
                );
      CompilerError::CompilerError(pCVar2,(string *)local_310);
      local_312 = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (local_20 == 1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_SampleMaskIn",&local_313);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_313);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_SampleMask",&local_314);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_314);
    }
  }
  else if (storage == 0x16) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_FragDepth",&local_107);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_107);
  }
  else if (storage == 0x17) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_HelperInvocation",&local_10e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_10e);
  }
  else if (storage == 0x18) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_NumWorkGroups",&local_108);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_108);
  }
  else if (storage == 0x19) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_WorkGroupSize",&local_109);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  else if (storage == 0x1a) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_WorkGroupID",&local_10a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_10a);
  }
  else if (storage == 0x1b) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_LocalInvocationID",&local_10b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_10b);
  }
  else if (storage == 0x1c) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_GlobalInvocationID",&local_10c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_10c);
  }
  else if (storage == 0x1d) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_LocalInvocationIndex",&local_10d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_10d);
  }
  else if (storage == 0x24) {
    request_subgroup_feature(this_00,SubgroupSize);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupSize",&local_3b5);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3b5);
  }
  else if (storage == 0x26) {
    request_subgroup_feature(this_00,NumSubgroups);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_NumSubgroups",&local_3b3);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3b3);
  }
  else if (storage == 0x28) {
    request_subgroup_feature(this_00,SubgroupID);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupID",&local_3b4);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3b4);
  }
  else if (storage == 0x29) {
    request_subgroup_feature(this_00,SubgroupInvocationID);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupInvocationID",&local_3b6);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3b6);
  }
  else if (storage == 0x2a) {
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_VertexID",&local_ac);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ac);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_VertexIndex",&local_ab);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ab);
    }
  }
  else if (storage == 0x2b) {
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 0x8c)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_d0,"GL_ARB_draw_instanced",&local_d1);
        require_extension_internal(this_00,(string *)local_d0);
        ::std::__cxx11::string::~string(local_d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      }
      if (((this_00->options).vertex.support_nonzero_base_instance & 1U) == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"gl_InstanceID",&local_fb);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_fb);
      }
      else {
        if (((this_00->options).vulkan_semantics & 1U) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_f8,"GL_ARB_shader_draw_parameters",&local_f9);
          require_extension_internal(this_00,(string *)local_f8);
          ::std::__cxx11::string::~string(local_f8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)this,"(gl_InstanceID + SPIRV_Cross_BaseInstance)",&local_fa);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_fa);
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_InstanceIndex",&local_ad);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ad);
    }
  }
  else if (storage == 0x1140) {
    request_subgroup_feature(this_00,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupEqMask",&local_3b7);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3b7);
  }
  else if (storage == 0x1141) {
    request_subgroup_feature(this_00,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupGeMask",&local_3b8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3b8);
  }
  else if (storage == 0x1142) {
    request_subgroup_feature(this_00,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupGtMask",&local_3b9);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  }
  else if (storage == 0x1143) {
    request_subgroup_feature(this_00,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupLeMask",&local_3ba);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3ba);
  }
  else if (storage == 0x1144) {
    request_subgroup_feature(this_00,SubgroupMask);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_SubgroupLtMask",&local_3bb);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3bb);
  }
  else if (storage == 0x1148) {
    if (((this_00->options).es & 1U) != 0) {
      local_132 = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_130,"BaseVertex not supported in ES profile.",&local_131)
      ;
      CompilerError::CompilerError(pCVar2,(string *)local_130);
      local_132 = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_180,"GL_ARB_shader_draw_parameters",&local_181);
      require_extension_internal(this_00,(string *)local_180);
      ::std::__cxx11::string::~string(local_180);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"SPIRV_Cross_BaseVertex",&local_182);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_182);
    }
    else if ((this_00->options).version < 0x1cc) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_158,"GL_ARB_shader_draw_parameters",&local_159);
      require_extension_internal(this_00,(string *)local_158);
      ::std::__cxx11::string::~string(local_158);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_159);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_BaseVertexARB",&local_15a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_15a);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_BaseVertex",&local_15b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_15b);
    }
  }
  else if (storage == 0x1149) {
    if (((this_00->options).es & 1U) != 0) {
      local_1aa = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1a8,"BaseInstance not supported in ES profile.",&local_1a9);
      CompilerError::CompilerError(pCVar2,(string *)local_1a8);
      local_1aa = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1f8,"GL_ARB_shader_draw_parameters",&local_1f9);
      require_extension_internal(this_00,(string *)local_1f8);
      ::std::__cxx11::string::~string(local_1f8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"SPIRV_Cross_BaseInstance",&local_1fa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1fa);
    }
    else if ((this_00->options).version < 0x1cc) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1d0,"GL_ARB_shader_draw_parameters",&local_1d1);
      require_extension_internal(this_00,(string *)local_1d0);
      ::std::__cxx11::string::~string(local_1d0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_BaseInstanceARB",&local_1d2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1d2);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_BaseInstance",&local_1d3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1d3);
    }
  }
  else if (storage == 0x114a) {
    if (((this_00->options).es & 1U) != 0) {
      local_222 = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_220,"DrawIndex not supported in ES profile.",&local_221);
      CompilerError::CompilerError(pCVar2,(string *)local_220);
      local_222 = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_270,"GL_ARB_shader_draw_parameters",&local_271);
      require_extension_internal(this_00,(string *)local_270);
      ::std::__cxx11::string::~string(local_270);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_271);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_DrawIDARB",&local_272);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_272);
    }
    else if ((this_00->options).version < 0x1cc) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_248,"GL_ARB_shader_draw_parameters",&local_249);
      require_extension_internal(this_00,(string *)local_248);
      ::std::__cxx11::string::~string(local_248);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_249);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_DrawIDARB",&local_24a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_24a);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_DrawID",&local_24b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_24b);
    }
  }
  else if (storage == 0x1156) {
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      local_532 = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_530,"Need Vulkan semantics for device group support.",&local_531);
      CompilerError::CompilerError(pCVar2,(string *)local_530);
      local_532 = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_558,"GL_EXT_device_group",&local_559);
    require_extension_internal(this_00,(string *)local_558);
    ::std::__cxx11::string::~string(local_558);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_559);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_DeviceIndex",&local_55a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_55a);
  }
  else if (storage == 0x1158) {
    if (((this_00->options).vulkan_semantics & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3b0,"GL_OVR_multiview2",&local_3b1);
      require_extension_internal(this_00,(string *)local_3b0);
      ::std::__cxx11::string::~string(local_3b0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_ViewID_OVR",&local_3b2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3b2);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_388,"GL_EXT_multiview",&local_389);
      require_extension_internal(this_00,(string *)local_388);
      ::std::__cxx11::string::~string(local_388);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_389);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"gl_ViewIndex",&local_38a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_38a);
    }
  }
  else if (storage == 0x1396) {
    if (((this_00->options).es & 1U) != 0) {
      local_50a = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_508,"Stencil export not supported in GLES.",&local_509);
      CompilerError::CompilerError(pCVar2,(string *)local_508);
      local_50a = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_4e0,"GL_ARB_shader_stencil_export",&local_4e1);
    require_extension_internal(this_00,(string *)local_4e0);
    ::std::__cxx11::string::~string(local_4e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_FragStencilRefARB",&local_4e2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4e2);
  }
  else if (storage == 0x14a6) {
    if ((((this_00->options).es & 1U) != 0) && ((this_00->options).version < 0x140)) {
      local_3f2 = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3f0,"gl_BaryCoordNV requires ESSL 320.",&local_3f1);
      CompilerError::CompilerError(pCVar2,(string *)local_3f0);
      local_3f2 = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 0x1c2)) {
      local_41a = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_418,"gl_BaryCoordNV requires GLSL 450.",&local_419);
      CompilerError::CompilerError(pCVar2,(string *)local_418);
      local_41a = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_440,"GL_NV_fragment_shader_barycentric",&local_441);
    require_extension_internal(this_00,(string *)local_440);
    ::std::__cxx11::string::~string(local_440);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_441);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_BaryCoordNV",&local_442);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_442);
  }
  else if (storage == 0x14a7) {
    if ((((this_00->options).es & 1U) != 0) && ((this_00->options).version < 0x140)) {
      local_46a = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_468,"gl_BaryCoordNoPerspNV requires ESSL 320.",&local_469);
      CompilerError::CompilerError(pCVar2,(string *)local_468);
      local_46a = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 0x1c2)) {
      local_492 = 1;
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_490,"gl_BaryCoordNoPerspNV requires GLSL 450.",&local_491);
      CompilerError::CompilerError(pCVar2,(string *)local_490);
      local_492 = 0;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_4b8,"GL_NV_fragment_shader_barycentric",&local_4b9);
    require_extension_internal(this_00,(string *)local_4b8);
    ::std::__cxx11::string::~string(local_4b8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_BaryCoordNoPerspNV",&local_4ba);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4ba);
  }
  else if (storage == 0x14c7) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_LaunchIDNV",&local_3bc);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3bc);
  }
  else if (storage == 0x14c8) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_LaunchSizeNV",&local_3bd);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3bd);
  }
  else if (storage == 0x14c9) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_WorldRayOriginNV",&local_3be);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3be);
  }
  else if (storage == 0x14ca) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_WorldRayDirectionNV",&local_3bf);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3bf);
  }
  else if (storage == 0x14cb) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_ObjectRayOriginNV",&local_3c0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c0);
  }
  else if (storage == 0x14cc) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_ObjectRayDirectionNV",&local_3c1);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  }
  else if (storage == 0x14cd) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_RayTminNV",&local_3c2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c2);
  }
  else if (storage == 0x14ce) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_RayTmaxNV",&local_3c3);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c3);
  }
  else if (storage == 0x14cf) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_InstanceCustomIndexNV",&local_3c4);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c4);
  }
  else if (storage == (StorageClassCallableDataKHR|StorageClassUniform)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_ObjectToWorldNV",&local_3c5);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c5);
  }
  else if (storage == (StorageClassCallableDataKHR|StorageClassOutput)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_WorldToObjectNV",&local_3c6);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c6);
  }
  else if (storage == (StorageClassCallableDataKHR|StorageClassWorkgroup)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_HitTNV",&local_3c7);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c7);
  }
  else if (storage == (StorageClassCallableDataKHR|StorageClassCrossWorkgroup)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_HitKindNV",&local_3c8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c8);
  }
  else if (storage == 0x14e7) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"gl_IncomingRayFlagsNV",&local_3c9);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  }
  else {
    convert_to_string<spv::BuiltIn,_0>(local_580,&local_1c);
    join<char_const(&)[12],std::__cxx11::string>
              ((spirv_cross *)this,(char (*) [12])"gl_BuiltIn_",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580);
    ::std::__cxx11::string::~string((string *)local_580);
  }
  return this;
}

Assistant:

string CompilerGLSL::builtin_to_glsl(BuiltIn builtin, StorageClass storage)
{
	switch (builtin)
	{
	case BuiltInPosition:
		return "gl_Position";
	case BuiltInPointSize:
		return "gl_PointSize";
	case BuiltInClipDistance:
		return "gl_ClipDistance";
	case BuiltInCullDistance:
		return "gl_CullDistance";
	case BuiltInVertexId:
		if (options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cannot implement gl_VertexID in Vulkan GLSL. This shader was created "
			                  "with GL semantics.");
		return "gl_VertexID";
	case BuiltInInstanceId:
		if (options.vulkan_semantics)
		{
			auto model = get_entry_point().model;
			switch (model)
			{
			case spv::ExecutionModelIntersectionKHR:
			case spv::ExecutionModelAnyHitKHR:
			case spv::ExecutionModelClosestHitKHR:
				// gl_InstanceID is allowed in these shaders.
				break;

			default:
				SPIRV_CROSS_THROW("Cannot implement gl_InstanceID in Vulkan GLSL. This shader was "
				                  "created with GL semantics.");
			}
		}
		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}
		return "gl_InstanceID";
	case BuiltInVertexIndex:
		if (options.vulkan_semantics)
			return "gl_VertexIndex";
		else
			return "gl_VertexID"; // gl_VertexID already has the base offset applied.
	case BuiltInInstanceIndex:
		if (options.vulkan_semantics)
			return "gl_InstanceIndex";

		if (!options.es && options.version < 140)
		{
			require_extension_internal("GL_ARB_draw_instanced");
		}

		if (options.vertex.support_nonzero_base_instance)
		{
			if (!options.vulkan_semantics)
			{
				// This is a soft-enable. We will opt-in to using gl_BaseInstanceARB if supported.
				require_extension_internal("GL_ARB_shader_draw_parameters");
			}
			return "(gl_InstanceID + SPIRV_Cross_BaseInstance)"; // ... but not gl_InstanceID.
		}
		else
			return "gl_InstanceID";
	case BuiltInPrimitiveId:
		if (storage == StorageClassInput && get_entry_point().model == ExecutionModelGeometry)
			return "gl_PrimitiveIDIn";
		else
			return "gl_PrimitiveID";
	case BuiltInInvocationId:
		return "gl_InvocationID";
	case BuiltInLayer:
		return "gl_Layer";
	case BuiltInViewportIndex:
		return "gl_ViewportIndex";
	case BuiltInTessLevelOuter:
		return "gl_TessLevelOuter";
	case BuiltInTessLevelInner:
		return "gl_TessLevelInner";
	case BuiltInTessCoord:
		return "gl_TessCoord";
	case BuiltInFragCoord:
		return "gl_FragCoord";
	case BuiltInPointCoord:
		return "gl_PointCoord";
	case BuiltInFrontFacing:
		return "gl_FrontFacing";
	case BuiltInFragDepth:
		return "gl_FragDepth";
	case BuiltInNumWorkgroups:
		return "gl_NumWorkGroups";
	case BuiltInWorkgroupSize:
		return "gl_WorkGroupSize";
	case BuiltInWorkgroupId:
		return "gl_WorkGroupID";
	case BuiltInLocalInvocationId:
		return "gl_LocalInvocationID";
	case BuiltInGlobalInvocationId:
		return "gl_GlobalInvocationID";
	case BuiltInLocalInvocationIndex:
		return "gl_LocalInvocationIndex";
	case BuiltInHelperInvocation:
		return "gl_HelperInvocation";

	case BuiltInBaseVertex:
		if (options.es)
			SPIRV_CROSS_THROW("BaseVertex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseVertexARB";
			}
			return "gl_BaseVertex";
		}
		else
		{
			// On regular GL, this is soft-enabled and we emit ifdefs in code.
			require_extension_internal("GL_ARB_shader_draw_parameters");
			return "SPIRV_Cross_BaseVertex";
		}
		break;

	case BuiltInBaseInstance:
		if (options.es)
			SPIRV_CROSS_THROW("BaseInstance not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_BaseInstanceARB";
			}
			return "gl_BaseInstance";
		}
		else
		{
			// On regular GL, this is soft-enabled and we emit ifdefs in code.
			require_extension_internal("GL_ARB_shader_draw_parameters");
			return "SPIRV_Cross_BaseInstance";
		}
		break;

	case BuiltInDrawIndex:
		if (options.es)
			SPIRV_CROSS_THROW("DrawIndex not supported in ES profile.");

		if (options.vulkan_semantics)
		{
			if (options.version < 460)
			{
				require_extension_internal("GL_ARB_shader_draw_parameters");
				return "gl_DrawIDARB";
			}
			return "gl_DrawID";
		}
		else
		{
			// On regular GL, this is soft-enabled and we emit ifdefs in code.
			require_extension_internal("GL_ARB_shader_draw_parameters");
			return "gl_DrawIDARB";
		}
		break;

	case BuiltInSampleId:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SampleID not supported before GLSL 400.");
		return "gl_SampleID";

	case BuiltInSampleMask:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SampleMask/gl_SampleMaskIn not supported before GLSL 400.");

		if (storage == StorageClassInput)
			return "gl_SampleMaskIn";
		else
			return "gl_SampleMask";

	case BuiltInSamplePosition:
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_sample_variables");
		if (!options.es && options.version < 400)
			SPIRV_CROSS_THROW("gl_SamplePosition not supported before GLSL 400.");
		return "gl_SamplePosition";

	case BuiltInViewIndex:
		if (options.vulkan_semantics)
		{
			require_extension_internal("GL_EXT_multiview");
			return "gl_ViewIndex";
		}
		else
		{
			require_extension_internal("GL_OVR_multiview2");
			return "gl_ViewID_OVR";
		}

	case BuiltInNumSubgroups:
		request_subgroup_feature(ShaderSubgroupSupportHelper::NumSubgroups);
		return "gl_NumSubgroups";

	case BuiltInSubgroupId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupID);
		return "gl_SubgroupID";

	case BuiltInSubgroupSize:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupSize);
		return "gl_SubgroupSize";

	case BuiltInSubgroupLocalInvocationId:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInvocationID);
		return "gl_SubgroupInvocationID";

	case BuiltInSubgroupEqMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupEqMask";

	case BuiltInSubgroupGeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGeMask";

	case BuiltInSubgroupGtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupGtMask";

	case BuiltInSubgroupLeMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLeMask";

	case BuiltInSubgroupLtMask:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupMask);
		return "gl_SubgroupLtMask";

	case BuiltInLaunchIdNV:
		return "gl_LaunchIDNV";
	case BuiltInLaunchSizeNV:
		return "gl_LaunchSizeNV";
	case BuiltInWorldRayOriginNV:
		return "gl_WorldRayOriginNV";
	case BuiltInWorldRayDirectionNV:
		return "gl_WorldRayDirectionNV";
	case BuiltInObjectRayOriginNV:
		return "gl_ObjectRayOriginNV";
	case BuiltInObjectRayDirectionNV:
		return "gl_ObjectRayDirectionNV";
	case BuiltInRayTminNV:
		return "gl_RayTminNV";
	case BuiltInRayTmaxNV:
		return "gl_RayTmaxNV";
	case BuiltInInstanceCustomIndexNV:
		return "gl_InstanceCustomIndexNV";
	case BuiltInObjectToWorldNV:
		return "gl_ObjectToWorldNV";
	case BuiltInWorldToObjectNV:
		return "gl_WorldToObjectNV";
	case BuiltInHitTNV:
		return "gl_HitTNV";
	case BuiltInHitKindNV:
		return "gl_HitKindNV";
	case BuiltInIncomingRayFlagsNV:
		return "gl_IncomingRayFlagsNV";

	case BuiltInBaryCoordNV:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordNV requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordNV requires GLSL 450.");
		require_extension_internal("GL_NV_fragment_shader_barycentric");
		return "gl_BaryCoordNV";
	}

	case BuiltInBaryCoordNoPerspNV:
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspNV requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("gl_BaryCoordNoPerspNV requires GLSL 450.");
		require_extension_internal("GL_NV_fragment_shader_barycentric");
		return "gl_BaryCoordNoPerspNV";
	}

	case BuiltInFragStencilRefEXT:
	{
		if (!options.es)
		{
			require_extension_internal("GL_ARB_shader_stencil_export");
			return "gl_FragStencilRefARB";
		}
		else
			SPIRV_CROSS_THROW("Stencil export not supported in GLES.");
	}

	case BuiltInDeviceIndex:
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Need Vulkan semantics for device group support.");
		require_extension_internal("GL_EXT_device_group");
		return "gl_DeviceIndex";

	default:
		return join("gl_BuiltIn_", convert_to_string(builtin));
	}
}